

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_basics.cpp
# Opt level: O0

void test_1d_dynamic<1ul>(void)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  value_type vVar4;
  ulong uVar5;
  size_type sVar6;
  reference t;
  int *local_b0;
  int *local_a8;
  size_type local_a0;
  int local_94;
  int *piStack_90;
  int i;
  int *dptr;
  allocator<int> local_71;
  undefined1 local_70 [8];
  vector<int,_std::allocator<int>_> data;
  size_type local_50;
  unsigned_long local_48;
  size_type local_40;
  int local_34;
  size_type local_30;
  bool local_22;
  bool local_21;
  dimensions<18446744073709551615UL> local_20;
  undefined1 local_18 [8];
  layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>_>
  l;
  
  std::experimental::dimensions<18446744073709551615UL>::dimensions<unsigned_long,_nullptr>
            (&local_20,1);
  std::experimental::
  layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>_>
  ::layout_mapping_right
            ((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>_>
              *)local_18,local_20);
  local_21 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>_>
             ::is_regular();
  local_22 = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0x3a,"void test_1d_dynamic() [X = 1UL]",&local_21,&local_22);
  local_30 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>_>
             ::stride((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>_>
                       *)local_18,0);
  local_34 = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0x3c,"void test_1d_dynamic() [X = 1UL]",&local_30,&local_34);
  local_40 = std::experimental::dimensions<18446744073709551615UL>::size
                       ((dimensions<18446744073709551615UL> *)local_18);
  local_48 = 1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0x3e,"void test_1d_dynamic() [X = 1UL]",&local_40,&local_48);
  local_50 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>_>
             ::span((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>_>
                     *)local_18);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","X",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
             ,0x3f,"void test_1d_dynamic() [X = 1UL]",&local_50,
             (unsigned_long *)
             &data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  vVar4 = std::experimental::dimensions<18446744073709551615UL>::operator[]<int>
                    ((dimensions<18446744073709551615UL> *)local_18,0);
  std::allocator<int>::allocator(&local_71);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_70,vVar4,&local_71);
  std::allocator<int>::~allocator(&local_71);
  piStack_90 = std::vector<int,_std::allocator<int>_>::data
                         ((vector<int,_std::allocator<int>_> *)local_70);
  local_94 = 0;
  while( true ) {
    uVar5 = (ulong)local_94;
    vVar4 = std::experimental::dimensions<18446744073709551615UL>::operator[]<int>
                      ((dimensions<18446744073709551615UL> *)local_18,0);
    if (vVar4 <= uVar5) break;
    local_a0 = std::experimental::
               layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>_>
               ::index<int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>_>
                             *)local_18,local_94);
    boost::detail::test_eq_impl<unsigned_long,int>
              ("(l.index(i))","i",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
               ,0x47,"void test_1d_dynamic() [X = 1UL]",&local_a0,&local_94);
    piVar2 = piStack_90;
    sVar6 = std::experimental::
            layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>_>
            ::index<int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>_>
                          *)local_18,local_94);
    local_a8 = piVar2 + sVar6;
    local_b0 = piStack_90 + local_94;
    boost::detail::test_eq_impl<int*,int*>
              ("&(dptr[l.index(i)])","&(dptr[i])",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
               ,0x49,"void test_1d_dynamic() [X = 1UL]",&local_a8,&local_b0);
    piVar2 = piStack_90;
    iVar1 = local_94;
    sVar6 = std::experimental::
            layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>_>
            ::index<int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>_>
                          *)local_18,local_94);
    piVar3 = piStack_90;
    piVar2[sVar6] = iVar1;
    sVar6 = std::experimental::
            layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>_>
            ::index<int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>_>
                          *)local_18,local_94);
    boost::detail::test_eq_impl<int,int>
              ("(dptr[l.index(i)])","i",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
               ,0x4d,"void test_1d_dynamic() [X = 1UL]",piVar3 + sVar6,&local_94);
    sVar6 = std::experimental::
            layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>_>
            ::index<int>((layout_mapping_right<std::experimental::dimensions<18446744073709551615UL>,_std::experimental::dimensions<1UL>,_std::experimental::dimensions<0UL>_>
                          *)local_18,local_94);
    t = std::vector<int,_std::allocator<int>_>::at
                  ((vector<int,_std::allocator<int>_> *)local_70,sVar6);
    boost::detail::test_eq_impl<int,int>
              ("(data.at(l.index(i)))","i",
               "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_basics.cpp"
               ,0x50,"void test_1d_dynamic() [X = 1UL]",t,&local_94);
    local_94 = local_94 + 1;
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_70);
  return;
}

Assistant:

void test_1d_dynamic()
{ // {{{
    layout_mapping_right<
        dimensions<dyn>, dimensions<1>, dimensions<0>
    > const l{{X}};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);

    BOOST_TEST_EQ((l.size()), X);
    BOOST_TEST_EQ((l.span()), X);

    vector<int> data(l[0]);
    int* dptr = data.data();

    // Set all elements to a unique value.
    for (auto i = 0; i < l[0]; ++i)
    {
        BOOST_TEST_EQ((l.index(i)), i);

        BOOST_TEST_EQ(&(dptr[l.index(i)]), &(dptr[i])); 

        dptr[l.index(i)] = i;

        BOOST_TEST_EQ((dptr[l.index(i)]), i); 

        // Bounds-checking.
        BOOST_TEST_EQ((data.at(l.index(i))), i); 
    }
}